

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O2

void writecode(uchar *block,aint length,unsigned_short loadaddr,bool header,FILE *fp)

{
  undefined7 in_register_00000009;
  ulong uVar1;
  ulong uVar2;
  
  if ((int)CONCAT71(in_register_00000009,header) != 0) {
    writeheader('\x03',"loader",(unsigned_short)length,loadaddr,0,fp);
  }
  writeword(length + 2,fp);
  parity = '\0';
  writebyte(0xff,fp);
  uVar1 = 0;
  uVar2 = (ulong)(uint)length;
  if (length < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    writebyte(block[uVar1],fp);
  }
  writebyte(parity,fp);
  return;
}

Assistant:

static void writecode(unsigned char* block, aint length, unsigned short loadaddr, bool header, FILE *fp) {
	if (header) {
		/* Filetype (3: Code) */
		writeheader(3, "loader", length, loadaddr, 0, fp);
	}

	/* Now onto the data bit */
	writeword(length + 2, fp);	/* Length of next block */
	parity = 0;
	writebyte(255, fp); /* Data... */
	for (aint i = 0; i < length; i++) {
		writebyte(block[i], fp);
	}
	writebyte(parity, fp);
}